

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
Shell::doAssertion(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,Assertion *assn)

{
  __index_type _Var1;
  
  _Var1 = (assn->
          super__Variant_base<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          ).
          super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          .
          super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          .
          super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          .
          super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          .
          super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
          ._M_index;
  if (_Var1 == '\x02') {
    assertModule(__return_storage_ptr__,this,(AssertModule *)assn);
  }
  else if (_Var1 == '\x01') {
    assertAction(__return_storage_ptr__,this,(AssertAction *)assn);
  }
  else {
    if (_Var1 != '\0') {
      wasm::handle_unreachable
                ("unexpected assertion",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0xfd);
    }
    assertReturn(__return_storage_ptr__,this,(AssertReturn *)assn);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> doAssertion(Assertion& assn) {
    if (auto* ret = std::get_if<AssertReturn>(&assn)) {
      return assertReturn(*ret);
    } else if (auto* act = std::get_if<AssertAction>(&assn)) {
      return assertAction(*act);
    } else if (auto* mod = std::get_if<AssertModule>(&assn)) {
      return assertModule(*mod);
    } else {
      WASM_UNREACHABLE("unexpected assertion");
    }
  }